

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::BamStandardIndex::CheckMagicNumber(BamStandardIndex *this)

{
  IBamIODevice *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  BamException *pBVar3;
  char magic [4];
  int local_6c;
  string local_68;
  string local_48;
  
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[5])(pIVar1,&local_6c,4);
  if (CONCAT44(extraout_var,iVar2) != 4) {
    pBVar3 = (BamException *)__cxa_allocate_exception(0x28);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"BamStandardIndex::CheckMagicNumber","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"could not read BAI magic number","");
    BamException::BamException(pBVar3,&local_48,&local_68);
    __cxa_throw(pBVar3,&BamException::typeinfo,BamException::~BamException);
  }
  if (local_6c == 0x1494142) {
    return;
  }
  pBVar3 = (BamException *)__cxa_allocate_exception(0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"BamStandardIndex::CheckMagicNumber","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"invalid BAI magic number","")
  ;
  BamException::BamException(pBVar3,&local_48,&local_68);
  __cxa_throw(pBVar3,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::CheckMagicNumber()
{

    // check 'magic number' to see if file is BAI index
    char magic[4];
    const int64_t numBytesRead = m_resources.Device->Read(magic, sizeof(magic));
    if (numBytesRead != 4) {
        throw BamException("BamStandardIndex::CheckMagicNumber", "could not read BAI magic number");
    }

    // compare to expected value
    if (std::strncmp(magic, BamStandardIndex::BAI_MAGIC, 4) != 0) {
        throw BamException("BamStandardIndex::CheckMagicNumber", "invalid BAI magic number");
    }
}